

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O0

ast_exit_t ** __thiscall deci::parser_t::value_type::as<deci::ast_exit_t*>(value_type *this)

{
  bool bVar1;
  ast_exit_t **ppaVar2;
  value_type *this_local;
  
  if (this->yytypeid_ == (type_info *)0x0) {
    __assert_fail("yytypeid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O0/iec61131.y.hpp"
                  ,0x136,"T &deci::parser_t::value_type::as() [T = deci::ast_exit_t *]");
  }
  bVar1 = std::type_info::operator==(this->yytypeid_,(type_info *)&ast_exit_t*::typeinfo);
  if (!bVar1) {
    __assert_fail("*yytypeid_ == typeid (T)",
                  "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O0/iec61131.y.hpp"
                  ,0x137,"T &deci::parser_t::value_type::as() [T = deci::ast_exit_t *]");
  }
  ppaVar2 = yyas_<deci::ast_exit_t*>(this);
  return ppaVar2;
}

Assistant:

T&
    as () YY_NOEXCEPT
    {
      YY_ASSERT (yytypeid_);
      YY_ASSERT (*yytypeid_ == typeid (T));
      YY_ASSERT (sizeof (T) <= size);
      return *yyas_<T> ();
    }